

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::process_restart(jpeg_decoder *this)

{
  uint uVar1;
  uint local_18;
  int local_14;
  int c;
  int i;
  jpeg_decoder *this_local;
  
  local_18 = 0;
  local_14 = 0x600;
  while ((0 < local_14 && (uVar1 = get_char(this), uVar1 != 0xff))) {
    local_14 = local_14 + -1;
  }
  if (local_14 == 0) {
    stop_decoding(this,JPGD_BAD_RESTART_MARKER);
  }
  while ((0 < local_14 && (local_18 = get_char(this), local_18 == 0xff))) {
    local_14 = local_14 + -1;
  }
  if (local_14 != 0) {
    if (local_18 == this->m_next_restart_num + 0xd0U) {
      memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
      this->m_eob_run = 0;
      this->m_restarts_left = this->m_restart_interval;
      this->m_next_restart_num = this->m_next_restart_num + 1U & 7;
      this->m_bits_left = 0x10;
      get_bits_no_markers(this,0x10);
      get_bits_no_markers(this,0x10);
      return;
    }
    stop_decoding(this,JPGD_BAD_RESTART_MARKER);
  }
  stop_decoding(this,JPGD_BAD_RESTART_MARKER);
}

Assistant:

void jpeg_decoder::process_restart()
	{
		int i;
		int c = 0;

		// Align to a byte boundry
		// FIXME: Is this really necessary? get_bits_no_markers() never reads in markers!
		//get_bits_no_markers(m_bits_left & 7);

		// Let's scan a little bit to find the marker, but not _too_ far.
		// 1536 is a "fudge factor" that determines how much to scan.
		for (i = 1536; i > 0; i--)
			if (get_char() == 0xFF)
				break;

		if (i == 0)
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		for (; i > 0; i--)
			if ((c = get_char()) != 0xFF)
				break;

		if (i == 0)
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		// Is it the expected marker? If not, something bad happened.
		if (c != (m_next_restart_num + M_RST0))
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		// Reset each component's DC prediction values.
		memset(&m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

		m_eob_run = 0;

		m_restarts_left = m_restart_interval;

		m_next_restart_num = (m_next_restart_num + 1) & 7;

		// Get the bit buffer going again...

		m_bits_left = 16;
		get_bits_no_markers(16);
		get_bits_no_markers(16);
	}